

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWSLoader.cpp
# Opt level: O3

void __thiscall
Assimp::LWSImporter::BuildGraph
          (LWSImporter *this,aiNode *nd,NodeDesc *src,
          vector<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_> *attach,
          BatchLoader *batch,aiCamera ***camOut,aiLight ***lightOut,
          vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> *animOut)

{
  pointer *ppAVar1;
  pointer *pppaVar2;
  undefined8 uVar3;
  anon_enum_32 aVar4;
  uint uVar5;
  aiLight **ppaVar6;
  aiCamera **ppaVar7;
  iterator __position;
  ulong uVar8;
  iterator __position_00;
  aiTexture **ppaVar9;
  double dVar10;
  aiNodeAnim *paVar11;
  aiNode *paVar12;
  Logger *this_00;
  long *plVar13;
  aiNode **ppaVar14;
  aiNode *paVar15;
  aiScene *paVar16;
  _List_node_base *p_Var17;
  float fVar18;
  aiNode *paVar19;
  float fVar20;
  aiScene *local_128;
  aiNodeAnim *anim;
  undefined1 local_f8 [24];
  undefined1 local_e0 [16];
  undefined1 local_d0 [160];
  
  SetupNodeName(this,nd,src);
  aVar4 = src->type;
  paVar12 = nd;
  if (aVar4 == CAMERA) {
    paVar15 = (aiNode *)operator_new(0x438);
    (paVar15->mName).length = 0;
    (paVar15->mName).data[0] = '\0';
    memset((paVar15->mName).data + 1,0x1b,0x3ff);
    (paVar15->mTransformation).a1 = 0.0;
    (paVar15->mTransformation).a2 = 0.0;
    (paVar15->mTransformation).a3 = 0.0;
    (paVar15->mTransformation).a4 = 0.0;
    (paVar15->mTransformation).b1 = 1.0;
    (paVar15->mTransformation).b2 = 0.0;
    (paVar15->mTransformation).b3 = 0.0;
    (paVar15->mTransformation).b4 = 0.0;
    (paVar15->mTransformation).c1 = 1.0;
    (paVar15->mTransformation).c2 = 0.7853982;
    (paVar15->mTransformation).c3 = 0.1;
    (paVar15->mTransformation).c4 = 1000.0;
    (paVar15->mTransformation).d1 = 0.0;
    ppaVar7 = *camOut;
    *camOut = ppaVar7 + 1;
    *ppaVar7 = (aiCamera *)paVar15;
    if (paVar15 != nd) {
      uVar5 = (nd->mName).length;
      (paVar15->mName).length = uVar5;
      memcpy((paVar15->mName).data,(nd->mName).data,(ulong)uVar5);
      (paVar15->mName).data[uVar5] = '\0';
    }
    goto LAB_004457f4;
  }
  if (aVar4 == LIGHT) {
    paVar15 = (aiNode *)operator_new(0x46c);
    (paVar15->mName).length = 0;
    (paVar15->mName).data[0] = '\0';
    memset((paVar15->mName).data + 1,0x1b,0x3ff);
    (paVar15->mTransformation).a1 = 0.0;
    (paVar15->mTransformation).a2 = 0.0;
    (paVar15->mTransformation).a3 = 0.0;
    (paVar15->mTransformation).a4 = 0.0;
    (paVar15->mTransformation).b1 = 0.0;
    (paVar15->mTransformation).b2 = 0.0;
    (paVar15->mTransformation).b3 = 0.0;
    (paVar15->mTransformation).b4 = 0.0;
    (paVar15->mTransformation).b4 = 0.0;
    (paVar15->mTransformation).c1 = 0.0;
    (paVar15->mTransformation).c2 = 0.0;
    (paVar15->mTransformation).c3 = 0.0;
    (paVar15->mTransformation).c4 = 1.0;
    (paVar15->mTransformation).d1 = 0.0;
    (paVar15->mTransformation).d2 = 0.0;
    (paVar15->mTransformation).d3 = 0.0;
    (paVar15->mTransformation).d4 = 0.0;
    *(undefined8 *)&paVar15->field_0x444 = 0;
    *(undefined8 *)((long)&paVar15->mParent + 4) = 0;
    *(undefined8 *)&paVar15->field_0x454 = 0;
    *(undefined8 *)((long)&paVar15->mChildren + 4) = 0x40c90fdb40c90fdb;
    *(undefined8 *)&paVar15->field_0x464 = 0;
    ppaVar6 = *lightOut;
    *lightOut = ppaVar6 + 1;
    *ppaVar6 = (aiLight *)paVar15;
    uVar3 = *(undefined8 *)&(src->lightColor).b;
    fVar18 = (float)((ulong)uVar3 >> 0x20);
    fVar20 = fVar18 * (src->lightColor).r;
    paVar19 = (aiNode *)CONCAT44(fVar18 * (float)uVar3,(src->lightColor).g * fVar18);
    *(float *)&paVar15->field_0x444 = fVar20;
    paVar15->mParent = paVar19;
    (paVar15->mTransformation).d2 = fVar20;
    *(aiNode **)&(paVar15->mTransformation).d3 = paVar19;
    if (paVar15 != nd) {
      uVar5 = (nd->mName).length;
      (paVar15->mName).length = uVar5;
      memcpy((paVar15->mName).data,(nd->mName).data,(ulong)uVar5);
      (paVar15->mName).data[uVar5] = '\0';
    }
    if (src->lightType == 1) {
      (paVar15->mTransformation).a1 = 1.4013e-45;
    }
    else if (src->lightType == 2) {
      (paVar15->mTransformation).a1 = 4.2039e-45;
      fVar18 = src->lightConeAngle * 0.017453292;
      *(float *)((long)&paVar15->mChildren + 4) = fVar18;
      paVar15->mNumMeshes = (uint)(src->lightEdgeAngle * 0.017453292 + fVar18);
    }
    else {
      (paVar15->mTransformation).a1 = 2.8026e-45;
    }
    if (src->lightFalloffType == 1) {
      (paVar15->mTransformation).c3 = 1.0;
    }
    else {
      (paVar15->mTransformation).d1 = 1.0;
    }
    goto LAB_004457f4;
  }
  if (aVar4 != OBJECT) goto LAB_004457f4;
  if ((src->path)._M_string_length == 0) {
LAB_004459f4:
    local_128 = (aiScene *)0x0;
  }
  else {
    local_128 = BatchLoader::GetImport(batch,src->id);
    if (local_128 == (aiScene *)0x0) {
      this_00 = DefaultLogger::get();
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
                     "LWS: Failed to read external file ",&src->path);
      Logger::error(this_00,(char *)local_e0._0_8_);
      if ((aiScene *)local_e0._0_8_ != (aiScene *)local_d0) {
        operator_delete((void *)local_e0._0_8_,(ulong)(local_d0._0_8_ + 1));
      }
      goto LAB_004459f4;
    }
    paVar12 = local_128->mRootNode;
    if (paVar12->mNumChildren == 1) {
      if (src->isPivotSet == false) {
        (src->pivotPos).x = (paVar12->mTransformation).a4;
        (src->pivotPos).y = (local_128->mRootNode->mTransformation).b4;
        (src->pivotPos).z = -(local_128->mRootNode->mTransformation).c4;
        paVar12 = local_128->mRootNode;
      }
      paVar15 = *paVar12->mChildren;
      *paVar12->mChildren = (aiNode *)0x0;
      paVar12 = local_128->mRootNode;
      if (paVar12 != (aiNode *)0x0) {
        aiNode::~aiNode(paVar12);
      }
      operator_delete(paVar12,0x478);
      local_128->mRootNode = paVar15;
      (paVar15->mTransformation).a4 = 0.0;
      (local_128->mRootNode->mTransformation).b4 = 0.0;
      (local_128->mRootNode->mTransformation).c4 = 0.0;
    }
  }
  anim = (aiNodeAnim *)local_f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&anim,"Pivot:","");
  plVar13 = (long *)std::__cxx11::string::append((char *)&anim);
  paVar16 = (aiScene *)(plVar13 + 2);
  if ((aiScene *)*plVar13 == paVar16) {
    local_d0._0_8_ = *(undefined8 *)paVar16;
    local_d0._8_8_ = plVar13[3];
    local_e0._0_8_ = (aiScene *)local_d0;
  }
  else {
    local_d0._0_8_ = *(undefined8 *)paVar16;
    local_e0._0_8_ = (aiScene *)*plVar13;
  }
  uVar3 = local_e0._0_8_;
  paVar12 = (aiNode *)plVar13[1];
  *plVar13 = (long)paVar16;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  local_e0._8_8_ = paVar12;
  if (paVar12 < (aiNode *)0x400) {
    (nd->mName).length = (ai_uint32)paVar12;
    memcpy((nd->mName).data,(void *)local_e0._0_8_,(size_t)paVar12);
    (nd->mName).data[(long)paVar12] = '\0';
  }
  if ((aiScene *)uVar3 != (aiScene *)local_d0) {
    operator_delete((void *)uVar3,(ulong)(local_d0._0_8_ + 1));
  }
  if (anim != (aiNodeAnim *)local_f8) {
    operator_delete(anim,local_f8._0_8_ + 1);
  }
  nd->mNumChildren = 1;
  ppaVar14 = (aiNode **)operator_new__(8);
  nd->mChildren = ppaVar14;
  paVar15 = (aiNode *)operator_new(0x478);
  paVar12 = paVar15;
  aiNode::aiNode(paVar15);
  *nd->mChildren = paVar15;
  (*nd->mChildren)->mParent = nd;
  ((*nd->mChildren)->mTransformation).a4 = -(src->pivotPos).x;
  ((*nd->mChildren)->mTransformation).b4 = -(src->pivotPos).y;
  ((*nd->mChildren)->mTransformation).c4 = -(src->pivotPos).z;
  SetupNodeName((LWSImporter *)paVar12,*nd->mChildren,src);
  paVar12 = *nd->mChildren;
  if (local_128 != (aiScene *)0x0) {
    local_e0._0_8_ = local_128;
    __position_00._M_current =
         (attach->
         super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    local_e0._8_8_ = paVar12;
    if (__position_00._M_current ==
        (attach->super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>::
      _M_realloc_insert<Assimp::AttachmentInfo>(attach,__position_00,(AttachmentInfo *)local_e0);
    }
    else {
      (__position_00._M_current)->scene = local_128;
      (__position_00._M_current)->attachToNode = paVar12;
      ppAVar1 = &(attach->
                 super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
      local_e0._0_8_ = local_128;
    }
  }
LAB_004457f4:
  LWO::AnimResolver::AnimResolver((AnimResolver *)local_e0,&src->channels,this->fps);
  local_f8._16_8_ = nd;
  LWO::AnimResolver::ExtractBindPose((AnimResolver *)local_e0,&nd->mTransformation);
  anim = (aiNodeAnim *)0x0;
  ppaVar9 = (aiTexture **)this->first;
  dVar10 = this->last;
  if (((double)ppaVar9 != dVar10) || (NAN((double)ppaVar9) || NAN(dVar10))) {
    local_d0._72_8_ = ppaVar9;
    local_d0._80_8_ = dVar10;
    LWO::AnimResolver::ClearAnimRangeSetup((AnimResolver *)local_e0);
    LWO::AnimResolver::UpdateAnimRangeSetup((AnimResolver *)local_e0);
    LWO::AnimResolver::ExtractAnimChannel((AnimResolver *)local_e0,&anim,3);
    paVar11 = anim;
    if (anim != (aiNodeAnim *)0x0) {
      if (anim != (aiNodeAnim *)local_f8._16_8_) {
        uVar5 = ((aiString *)local_f8._16_8_)->length;
        (anim->mNodeName).length = uVar5;
        memcpy((anim->mNodeName).data,((aiString *)local_f8._16_8_)->data,(ulong)uVar5);
        (paVar11->mNodeName).data[uVar5] = '\0';
      }
      __position._M_current =
           (animOut->super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (animOut->super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<aiNodeAnim*,std::allocator<aiNodeAnim*>>::_M_realloc_insert<aiNodeAnim*const&>
                  ((vector<aiNodeAnim*,std::allocator<aiNodeAnim*>> *)animOut,__position,&anim);
      }
      else {
        *__position._M_current = anim;
        pppaVar2 = &(animOut->super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
        *pppaVar2 = *pppaVar2 + 1;
      }
    }
  }
  if ((src->children).
      super__List_base<Assimp::LWS::NodeDesc_*,_std::allocator<Assimp::LWS::NodeDesc_*>_>._M_impl.
      _M_node.super__List_node_base._M_next != (_List_node_base *)&src->children) {
    uVar8 = (src->children).
            super__List_base<Assimp::LWS::NodeDesc_*,_std::allocator<Assimp::LWS::NodeDesc_*>_>.
            _M_impl._M_node._M_size;
    ppaVar14 = (aiNode **)operator_new__(-(ulong)(uVar8 >> 0x3d != 0) | uVar8 << 3);
    paVar12->mChildren = ppaVar14;
    for (p_Var17 = (src->children).
                   super__List_base<Assimp::LWS::NodeDesc_*,_std::allocator<Assimp::LWS::NodeDesc_*>_>
                   ._M_impl._M_node.super__List_node_base._M_next;
        p_Var17 != (_List_node_base *)&src->children; p_Var17 = p_Var17->_M_next) {
      paVar15 = (aiNode *)operator_new(0x478);
      aiNode::aiNode(paVar15);
      uVar5 = paVar12->mNumChildren;
      paVar12->mNumChildren = uVar5 + 1;
      paVar12->mChildren[uVar5] = paVar15;
      paVar15->mParent = paVar12;
      BuildGraph(this,paVar15,(NodeDesc *)p_Var17[1]._M_next,attach,batch,camOut,lightOut,animOut);
    }
  }
  return;
}

Assistant:

void LWSImporter::BuildGraph(aiNode* nd, LWS::NodeDesc& src, std::vector<AttachmentInfo>& attach,
    BatchLoader& batch,
    aiCamera**& camOut,
    aiLight**& lightOut,
    std::vector<aiNodeAnim*>& animOut)
{
    // Setup a very cryptic name for the node, we want the user to be happy
    SetupNodeName(nd,src);
    aiNode* ndAnim = nd;

    // If the node is an object
    if (src.type == LWS::NodeDesc::OBJECT) {

        // If the object is from an external file, get it
        aiScene* obj = NULL;
        if (src.path.length() ) {
            obj = batch.GetImport(src.id);
            if (!obj) {
                ASSIMP_LOG_ERROR("LWS: Failed to read external file " + src.path);
            }
            else {
                if (obj->mRootNode->mNumChildren == 1) {

                    //If the pivot is not set for this layer, get it from the external object
                    if (!src.isPivotSet) {
                        src.pivotPos.x = +obj->mRootNode->mTransformation.a4;
                        src.pivotPos.y = +obj->mRootNode->mTransformation.b4;
                        src.pivotPos.z = -obj->mRootNode->mTransformation.c4; //The sign is the RH to LH back conversion
                    }

                    //Remove first node from obj (the old pivot), reset transform of second node (the mesh node)
                    aiNode* newRootNode = obj->mRootNode->mChildren[0];
                    obj->mRootNode->mChildren[0] = NULL;
                    delete obj->mRootNode;

                    obj->mRootNode = newRootNode;
                    obj->mRootNode->mTransformation.a4 = 0.0;
                    obj->mRootNode->mTransformation.b4 = 0.0;
                    obj->mRootNode->mTransformation.c4 = 0.0;
                }
            }
        }

        //Setup the pivot node (also the animation node), the one we received
        nd->mName = std::string("Pivot:") + nd->mName.data;
        ndAnim = nd;

        //Add the attachment node to it
        nd->mNumChildren = 1;
        nd->mChildren = new aiNode*[1];
        nd->mChildren[0] = new aiNode();
        nd->mChildren[0]->mParent = nd;
        nd->mChildren[0]->mTransformation.a4 = -src.pivotPos.x;
        nd->mChildren[0]->mTransformation.b4 = -src.pivotPos.y;
        nd->mChildren[0]->mTransformation.c4 = -src.pivotPos.z;
        SetupNodeName(nd->mChildren[0], src);

        //Update the attachment node
        nd = nd->mChildren[0];

        //Push attachment, if the object came from an external file
        if (obj) {
            attach.push_back(AttachmentInfo(obj,nd));
        }
    }

    // If object is a light source - setup a corresponding ai structure
    else if (src.type == LWS::NodeDesc::LIGHT) {
        aiLight* lit = *lightOut++ = new aiLight();

        // compute final light color
        lit->mColorDiffuse = lit->mColorSpecular = src.lightColor*src.lightIntensity;

        // name to attach light to node -> unique due to LWs indexing system
        lit->mName = nd->mName;

        // determine light type and setup additional members
        if (src.lightType == 2) { /* spot light */

            lit->mType = aiLightSource_SPOT;
            lit->mAngleInnerCone = (float)AI_DEG_TO_RAD( src.lightConeAngle );
            lit->mAngleOuterCone = lit->mAngleInnerCone+(float)AI_DEG_TO_RAD( src.lightEdgeAngle );

        }
        else if (src.lightType == 1) { /* directional light source */
            lit->mType = aiLightSource_DIRECTIONAL;
        }
        else lit->mType = aiLightSource_POINT;

        // fixme: no proper handling of light falloffs yet
        if (src.lightFalloffType == 1)
            lit->mAttenuationConstant = 1.f;
        else if (src.lightFalloffType == 1)
            lit->mAttenuationLinear = 1.f;
        else
            lit->mAttenuationQuadratic = 1.f;
    }

    // If object is a camera - setup a corresponding ai structure
    else if (src.type == LWS::NodeDesc::CAMERA) {
        aiCamera* cam = *camOut++ = new aiCamera();

        // name to attach cam to node -> unique due to LWs indexing system
        cam->mName = nd->mName;
    }

    // Get the node transformation from the LWO key
    LWO::AnimResolver resolver(src.channels,fps);
    resolver.ExtractBindPose(ndAnim->mTransformation);

    // .. and construct animation channels
    aiNodeAnim* anim = NULL;

    if (first != last) {
        resolver.SetAnimationRange(first,last);
        resolver.ExtractAnimChannel(&anim,AI_LWO_ANIM_FLAG_SAMPLE_ANIMS|AI_LWO_ANIM_FLAG_START_AT_ZERO);
        if (anim) {
            anim->mNodeName = ndAnim->mName;
            animOut.push_back(anim);
        }
    }

    // Add children
    if (!src.children.empty()) {
        nd->mChildren = new aiNode*[src.children.size()];
        for (std::list<LWS::NodeDesc*>::iterator it = src.children.begin(); it != src.children.end(); ++it) {
            aiNode* ndd = nd->mChildren[nd->mNumChildren++] = new aiNode();
            ndd->mParent = nd;

            BuildGraph(ndd,**it,attach,batch,camOut,lightOut,animOut);
        }
    }
}